

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.c
# Opt level: O3

void kmpc_get_poolstat(size_t *maxmem,size_t *allmem)

{
  long lVar1;
  kmp_info_t *th;
  long lVar2;
  long lVar3;
  kmp_info_t **ppkVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  
  ppkVar4 = __kmp_threads;
  iVar5 = __kmp_get_global_thread_id();
  th = ppkVar4[iVar5];
  __kmp_bget_dequeue(th);
  lVar2 = *(long *)(th->th_pad + 0x118);
  sVar6 = 0;
  sVar7 = 0;
  lVar9 = 0;
  do {
    lVar1 = lVar2 + lVar9 * 0x30;
    lVar10 = lVar1;
    for (lVar3 = *(long *)(lVar2 + 0x20 + lVar9 * 0x30); lVar3 != lVar1;
        lVar3 = *(long *)(lVar3 + 0x20)) {
      if ((lVar10 == lVar1) || (*(long *)(lVar3 + 0x10) < *(long *)(lVar10 + 0x10))) {
        lVar10 = lVar3;
      }
      sVar7 = (sVar7 + *(long *)(lVar3 + 0x10)) - 0x20;
    }
    if ((long)sVar6 <= (long)*(size_t *)(lVar10 + 0x10)) {
      sVar6 = *(size_t *)(lVar10 + 0x10);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x14);
  sVar8 = sVar6 - 0x20;
  if ((long)sVar6 < 0x21) {
    sVar8 = sVar6;
  }
  *maxmem = sVar8;
  *allmem = sVar7;
  return;
}

Assistant:

void
kmpc_get_poolstat( size_t *maxmem, size_t *allmem )
{
    kmp_info_t *th = __kmp_get_thread();
    bufsize a, b;

    __kmp_bget_dequeue( th );         /* Release any queued buffers */

    bcheck( th, &a, &b );

    *maxmem = a;
    *allmem = b;
}